

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeNF
          (ChElementBeamANCF_3243 *this,double xi,double eta,double zeta,ChVectorDynamic<> *Qi,
          double *detJ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double *pdVar1;
  undefined8 uVar2;
  double dVar3;
  Product<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
  PVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  void *pvVar13;
  long lVar14;
  undefined8 *puVar15;
  double *pdVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [16];
  Product<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
  *src;
  undefined1 auVar21 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar22 [32];
  undefined1 auVar26 [64];
  undefined1 auVar23 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  double dVar37;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  ChMatrix33<double> J_Cxi;
  VectorN G_C;
  VectorN G_B;
  VectorN G_A;
  MatrixNx3c Sxi_D;
  VectorN Sxi_compact;
  ChMatrix33<double> J_Cxi_Inv;
  MatrixNx3 QiCompact;
  Matrix3xN e_bar;
  double local_498 [5];
  ulong local_470;
  double local_468;
  double local_460;
  double local_458;
  double local_450;
  ulong local_448;
  undefined1 local_440 [64];
  assign_op<double,_double> local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [128];
  undefined1 local_300 [64];
  VectorN local_2c0;
  Matrix<double,_3,_3,_1,_3,_3> local_248;
  Matrix<double,_8,_3,_1,_8,_3> local_200;
  Product<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
  local_140 [4];
  
  local_498[0] = eta;
  local_498[1] = zeta;
  Calc_Sxi_compact(this,&local_2c0,xi,eta,zeta);
  lVar14 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (2 < lVar14) {
    local_140[0].m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
    m_data = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    src = local_140;
    local_140[0].m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
    m_rows.m_value = 3;
    local_140[0].m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    m_startRow.m_value = 0;
    local_140[0].m_lhs = &local_2c0;
    local_140[0].m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_xpr =
         F;
    local_140[0].m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    m_outerStride = lVar14;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,8,3,1,8,3>,Eigen::Product<Eigen::Matrix<double,8,1,0,8,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>,0>,Eigen::internal::assign_op<double,double>>
              (&local_200,src,(assign_op<double,_double> *)local_380,(type)0x0);
    if ((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
        0x18) {
      pdVar16 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      if (pdVar16 != (double *)0x0) {
        free((void *)pdVar16[-1]);
      }
      pvVar13 = malloc(0x100);
      if (pvVar13 == (void *)0x0) {
        pdVar16 = (double *)0x0;
      }
      else {
        *(void **)(((ulong)pvVar13 & 0xffffffffffffffc0) + 0x38) = pvVar13;
        pdVar16 = (double *)(((ulong)pvVar13 & 0xffffffffffffffc0) + 0x40);
      }
      if (pdVar16 == (double *)0x0) {
        puVar15 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar15 = std::ostream::_M_insert<bool>;
        __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           pdVar16;
      (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0x18;
    }
    if ((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
        0x18) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Map<Eigen::Matrix<double, 24, 1>>, T1 = double, T2 = double]"
                   );
    }
    pdVar16 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar17 = 0xfffffffffffffff8;
    do {
      dVar34 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[uVar17 + 9];
      dVar37 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[uVar17 + 10];
      dVar3 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array[uVar17 + 0xb];
      dVar9 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array[uVar17 + 0xc];
      dVar10 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[uVar17 + 0xd];
      dVar11 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[uVar17 + 0xe];
      dVar12 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[uVar17 + 0xf];
      pdVar1 = pdVar16 + uVar17 + 8;
      *pdVar1 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                m_data.array[uVar17 + 8];
      pdVar1[1] = dVar34;
      pdVar1[2] = dVar37;
      pdVar1[3] = dVar3;
      pdVar1[4] = dVar9;
      pdVar1[5] = dVar10;
      pdVar1[6] = dVar11;
      pdVar1[7] = dVar12;
      uVar17 = uVar17 + 8;
    } while (uVar17 < 0x10);
    CalcCoordMatrix(this,(Matrix3xN *)src);
    Calc_Sxi_D(this,(MatrixNx3c *)local_380,xi,local_498[0],local_498[1]);
    auVar5 = local_300;
    auVar28 = local_380._64_64_;
    auVar27 = local_380._0_64_;
    lVar14 = 0x10;
    do {
      PVar4 = *src;
      auVar24 = vmulpd_avx512f((undefined1  [64])PVar4,auVar27);
      auVar21 = vextractf64x4_avx512f(auVar24,1);
      auVar25 = vmulpd_avx512f((undefined1  [64])PVar4,auVar28);
      auVar22 = vextractf64x4_avx512f(auVar25,1);
      auVar26 = vmulpd_avx512f((undefined1  [64])PVar4,auVar5);
      auVar23 = vextractf64x4_avx512f(auVar26,1);
      dVar34 = auVar26._0_8_ + auVar23._0_8_ + auVar26._8_8_ + auVar23._8_8_;
      dVar37 = auVar26._16_8_ + auVar23._16_8_ + auVar26._24_8_ + auVar23._24_8_;
      auVar35._0_8_ = dVar34 + dVar37;
      auVar35._8_8_ = dVar34 + dVar37;
      *(double *)((long)local_498 + lVar14) =
           auVar24._0_8_ + auVar21._0_8_ + auVar24._8_8_ + auVar21._8_8_ +
           auVar24._16_8_ + auVar21._16_8_ + auVar24._24_8_ + auVar21._24_8_;
      *(double *)((long)local_498 + lVar14 + 8) =
           auVar25._0_8_ + auVar22._0_8_ + auVar25._8_8_ + auVar22._8_8_ +
           auVar25._16_8_ + auVar22._16_8_ + auVar25._24_8_ + auVar22._24_8_;
      uVar2 = vmovlpd_avx(auVar35);
      *(undefined8 *)((long)local_498 + lVar14 + 0x10) = uVar2;
      lVar14 = lVar14 + 0x18;
      src = src + 1;
    } while (lVar14 != 0x58);
    local_3c0._0_8_ = local_498 + 2;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_248,(SrcXprType *)local_3c0,local_400);
    auVar27._8_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar27._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar27._16_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar27._24_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar27._32_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar27._40_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar27._48_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar27._56_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar27 = vmulpd_avx512f(local_380._0_64_,auVar27);
    auVar28._8_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar28._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar28._16_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar28._24_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar28._32_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar28._40_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar28._48_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar28._56_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar28 = vmulpd_avx512f(local_380._64_64_,auVar28);
    auVar27 = vaddpd_avx512f(auVar27,auVar28);
    auVar5._8_8_ = local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[6];
    auVar5._0_8_ = local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[6];
    auVar5._16_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar5._24_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar5._32_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar5._40_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar5._48_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar5._56_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar28 = vmulpd_avx512f(local_300,auVar5);
    local_3c0 = vaddpd_avx512f(auVar27,auVar28);
    auVar24._8_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar24._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar24._16_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar24._24_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar24._32_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar24._40_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar24._48_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar24._56_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar27 = vmulpd_avx512f(local_380._0_64_,auVar24);
    auVar25._8_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar25._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar25._16_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar25._24_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar25._32_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar25._40_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar25._48_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar25._56_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar28 = vmulpd_avx512f(local_380._64_64_,auVar25);
    auVar27 = vaddpd_avx512f(auVar27,auVar28);
    auVar26._8_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar26._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar26._16_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar26._24_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar26._32_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar26._40_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar26._48_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar26._56_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar28 = vmulpd_avx512f(local_300,auVar26);
    auVar27 = vaddpd_avx512f(auVar27,auVar28);
    local_400[0] = (assign_op<double,_double>)auVar27[0];
    local_400[1] = (assign_op<double,_double>)auVar27[1];
    local_400[2] = (assign_op<double,_double>)auVar27[2];
    local_400[3] = (assign_op<double,_double>)auVar27[3];
    local_400[4] = (assign_op<double,_double>)auVar27[4];
    local_400[5] = (assign_op<double,_double>)auVar27[5];
    local_400[6] = (assign_op<double,_double>)auVar27[6];
    local_400[7] = (assign_op<double,_double>)auVar27[7];
    local_400[8] = (assign_op<double,_double>)auVar27[8];
    local_400[9] = (assign_op<double,_double>)auVar27[9];
    local_400[10] = (assign_op<double,_double>)auVar27[10];
    local_400[0xb] = (assign_op<double,_double>)auVar27[0xb];
    local_400[0xc] = (assign_op<double,_double>)auVar27[0xc];
    local_400[0xd] = (assign_op<double,_double>)auVar27[0xd];
    local_400[0xe] = (assign_op<double,_double>)auVar27[0xe];
    local_400[0xf] = (assign_op<double,_double>)auVar27[0xf];
    local_400[0x10] = (assign_op<double,_double>)auVar27[0x10];
    local_400[0x11] = (assign_op<double,_double>)auVar27[0x11];
    local_400[0x12] = (assign_op<double,_double>)auVar27[0x12];
    local_400[0x13] = (assign_op<double,_double>)auVar27[0x13];
    local_400[0x14] = (assign_op<double,_double>)auVar27[0x14];
    local_400[0x15] = (assign_op<double,_double>)auVar27[0x15];
    local_400[0x16] = (assign_op<double,_double>)auVar27[0x16];
    local_400[0x17] = (assign_op<double,_double>)auVar27[0x17];
    local_400[0x18] = (assign_op<double,_double>)auVar27[0x18];
    local_400[0x19] = (assign_op<double,_double>)auVar27[0x19];
    local_400[0x1a] = (assign_op<double,_double>)auVar27[0x1a];
    local_400[0x1b] = (assign_op<double,_double>)auVar27[0x1b];
    local_400[0x1c] = (assign_op<double,_double>)auVar27[0x1c];
    local_400[0x1d] = (assign_op<double,_double>)auVar27[0x1d];
    local_400[0x1e] = (assign_op<double,_double>)auVar27[0x1e];
    local_400[0x1f] = (assign_op<double,_double>)auVar27[0x1f];
    local_400[0x20] = (assign_op<double,_double>)auVar27[0x20];
    local_400[0x21] = (assign_op<double,_double>)auVar27[0x21];
    local_400[0x22] = (assign_op<double,_double>)auVar27[0x22];
    local_400[0x23] = (assign_op<double,_double>)auVar27[0x23];
    local_400[0x24] = (assign_op<double,_double>)auVar27[0x24];
    local_400[0x25] = (assign_op<double,_double>)auVar27[0x25];
    local_400[0x26] = (assign_op<double,_double>)auVar27[0x26];
    local_400[0x27] = (assign_op<double,_double>)auVar27[0x27];
    local_400[0x28] = (assign_op<double,_double>)auVar27[0x28];
    local_400[0x29] = (assign_op<double,_double>)auVar27[0x29];
    local_400[0x2a] = (assign_op<double,_double>)auVar27[0x2a];
    local_400[0x2b] = (assign_op<double,_double>)auVar27[0x2b];
    local_400[0x2c] = (assign_op<double,_double>)auVar27[0x2c];
    local_400[0x2d] = (assign_op<double,_double>)auVar27[0x2d];
    local_400[0x2e] = (assign_op<double,_double>)auVar27[0x2e];
    local_400[0x2f] = (assign_op<double,_double>)auVar27[0x2f];
    local_400[0x30] = (assign_op<double,_double>)auVar27[0x30];
    local_400[0x31] = (assign_op<double,_double>)auVar27[0x31];
    local_400[0x32] = (assign_op<double,_double>)auVar27[0x32];
    local_400[0x33] = (assign_op<double,_double>)auVar27[0x33];
    local_400[0x34] = (assign_op<double,_double>)auVar27[0x34];
    local_400[0x35] = (assign_op<double,_double>)auVar27[0x35];
    local_400[0x36] = (assign_op<double,_double>)auVar27[0x36];
    local_400[0x37] = (assign_op<double,_double>)auVar27[0x37];
    local_400[0x38] = (assign_op<double,_double>)auVar27[0x38];
    local_400[0x39] = (assign_op<double,_double>)auVar27[0x39];
    local_400[0x3a] = (assign_op<double,_double>)auVar27[0x3a];
    local_400[0x3b] = (assign_op<double,_double>)auVar27[0x3b];
    local_400[0x3c] = (assign_op<double,_double>)auVar27[0x3c];
    local_400[0x3d] = (assign_op<double,_double>)auVar27[0x3d];
    local_400[0x3e] = (assign_op<double,_double>)auVar27[0x3e];
    local_400[0x3f] = (assign_op<double,_double>)auVar27[0x3f];
    auVar6._8_8_ = local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[2];
    auVar6._0_8_ = local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[2];
    auVar6._16_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar6._24_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar6._32_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar6._40_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar6._48_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar6._56_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar27 = vmulpd_avx512f(local_380._0_64_,auVar6);
    auVar7._8_8_ = local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[5];
    auVar7._0_8_ = local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[5];
    auVar7._16_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar7._24_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar7._32_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar7._40_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar7._48_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar7._56_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar28 = vmulpd_avx512f(local_380._64_64_,auVar7);
    auVar27 = vaddpd_avx512f(auVar27,auVar28);
    auVar8._8_8_ = local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[8];
    auVar8._0_8_ = local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[8];
    auVar8._16_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar8._24_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar8._32_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar8._40_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar8._48_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar8._56_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar28 = vmulpd_avx512f(local_300,auVar8);
    local_440 = vaddpd_avx512f(auVar27,auVar28);
    if (5 < (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar16 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      auVar20._8_8_ = 0x3fe0000000000000;
      auVar20._0_8_ = 0x3fe0000000000000;
      auVar20 = vmulpd_avx512vl(*(undefined1 (*) [16])(pdVar16 + 3),auVar20);
      dVar34 = pdVar16[5] * 0.5;
      auVar35 = vshufpd_avx(auVar20,auVar20,1);
      pdVar16 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      lVar14 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      ;
      lVar18 = 2;
      lVar19 = 0;
      while (lVar18 + -2 < lVar14) {
        dVar37 = *(double *)(local_440 + lVar19);
        auVar41._8_8_ = 0;
        auVar41._0_8_ = dVar37;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(double *)(local_400 + lVar19);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(double *)(local_400 + lVar19) * -dVar34;
        auVar41 = vfmadd231sd_fma(auVar44,auVar35,auVar41);
        pdVar16[lVar18 + -2] = auVar41._0_8_ + pdVar16[lVar18 + -2];
        if (lVar14 <= lVar18 + -1) break;
        dVar3 = *(double *)(local_3c0 + lVar19);
        auVar45._8_8_ = 0;
        auVar45._0_8_ = dVar3;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = dVar34;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = dVar37 * -auVar20._0_8_;
        auVar41 = vfmadd231sd_fma(auVar42,auVar30,auVar45);
        pdVar16[lVar18 + -1] = auVar41._0_8_ + pdVar16[lVar18 + -1];
        if (lVar14 <= lVar18) break;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = dVar3 * -auVar35._0_8_;
        auVar41 = vfmadd213sd_fma(auVar40,auVar20,auVar43);
        pdVar16[lVar18] = auVar41._0_8_ + pdVar16[lVar18];
        lVar18 = lVar18 + 3;
        lVar19 = lVar19 + 8;
        if (lVar18 == 0x1a) {
          auVar29._8_8_ = 0;
          auVar29._0_8_ = local_470;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = local_468;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = local_448;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = local_450;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = local_450 * local_460;
          auVar35 = vfmsub231sd_fma(auVar39,auVar31,auVar33);
          auVar36._8_8_ = 0;
          auVar36._0_8_ = local_458 * local_460;
          auVar20 = vfmsub231sd_fma(auVar36,auVar29,auVar33);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = local_458 * local_468;
          auVar41 = vfmsub231sd_fma(auVar32,auVar29,auVar38);
          *detJ = auVar41._0_8_ * local_498[4] +
                  (auVar35._0_8_ * local_498[2] - auVar20._0_8_ * local_498[3]);
          return;
        }
      }
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementBeamANCF_3243::ComputeNF(
    const double xi,             // parametric coordinate in volume
    const double eta,            // parametric coordinate in volume
    const double zeta,           // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    // Compute the generalized force vector for the applied force component using the compact form of the shape
    // functions.  This requires a reshaping of the calculated matrix to get it into the correct vector order (just a
    // reinterpretation of the data since the matrix is in row-major format)
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, eta, zeta);
    MatrixNx3 QiCompact;

    QiCompact = Sxi_compact * F.segment(0, 3).transpose();

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Qi = QiReshaped;

    // Compute the generalized force vector for the applied moment component
    // See: Antonio M Recuero, Javier F Aceituno, Jose L Escalona, and Ahmed A Shabana.
    // A nonlinear approach for modeling rail flexibility using the absolute nodal coordinate
    // formulation. Nonlinear Dynamics, 83(1-2):463-481, 2016.

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    MatrixNx3c Sxi_D;
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_Cxi;
    ChMatrix33<double> J_Cxi_Inv;

    J_Cxi.noalias() = e_bar * Sxi_D;
    J_Cxi_Inv = J_Cxi.inverse();

    // Compute the unique pieces that make up the moment projection matrix "G"
    VectorN G_A = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 0) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 0) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 0);
    VectorN G_B = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 1) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 1) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 1);
    VectorN G_C = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 2) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 2) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 2);

    ChVectorN<double, 3> M_scaled = 0.5 * F.segment(3, 3);

    // Compute G'M without actually forming the complete matrix "G" (since it has a sparsity pattern to it)
    for (unsigned int i = 0; i < NSF; i++) {
        Qi(3 * i) += M_scaled(1) * G_C(i) - M_scaled(2) * G_B(i);
        Qi((3 * i) + 1) += M_scaled(2) * G_A(i) - M_scaled(0) * G_C(i);
        Qi((3 * i) + 2) += M_scaled(0) * G_B(i) - M_scaled(1) * G_A(i);
    }

    // Compute the element Jacobian between the current configuration and the normalized configuration
    // This is different than the element Jacobian between the reference configuration and the normalized
    //  configuration used in the internal force calculations.  For this calculation, this is the ratio between the
    //  actual differential volume and the normalized differential volume.  The determinate of the element Jacobian is
    //  used to calculate this volume ratio for potential use in Gauss-Quadrature or similar numeric integration.
    detJ = J_Cxi.determinant();
}